

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dblk_compr.c
# Opt level: O2

UINT8 ReadComprDataBlkHdr(UINT32 inLen,UINT8 *inData,PCM_CDB_INF *retCdbInf)

{
  byte bVar1;
  UINT8 UVar2;
  
  UVar2 = '\x10';
  if (4 < inLen) {
    bVar1 = *inData;
    (retCdbInf->cmprInfo).comprType = bVar1;
    retCdbInf->decmpLen = *(UINT32 *)(inData + 1);
    retCdbInf->hdrSize = 0;
    UVar2 = 0x80;
    if ((bVar1 < 2) && (UVar2 = '\x10', 9 < inLen)) {
      (retCdbInf->cmprInfo).bitsDec = inData[5];
      (retCdbInf->cmprInfo).bitsCmp = inData[6];
      (retCdbInf->cmprInfo).subType = inData[7];
      (retCdbInf->cmprInfo).baseVal = *(UINT16 *)(inData + 8);
      retCdbInf->hdrSize = 10;
      UVar2 = '\0';
    }
  }
  return UVar2;
}

Assistant:

UINT8 ReadComprDataBlkHdr(UINT32 inLen, const UINT8* inData, PCM_CDB_INF* retCdbInf)
{
	PCM_CMP_INF* cParam;
	UINT32 curPos;
	
	if (inLen < 0x05)
		return 0x10;	// not enough data
	
	cParam = &retCdbInf->cmprInfo;
	cParam->comprType = inData[0x00];
	retCdbInf->decmpLen = ReadLE32(&inData[0x01]);
	retCdbInf->hdrSize = 0x00;
	curPos = 0x05;
	
	switch(cParam->comprType)
	{
	case 0x00:	// Bit Packing compression
	case 0x01:	// Delta-PCM
		if (inLen < curPos + 0x05)
			return 0x10;	// not enough data
		cParam->bitsDec = inData[curPos + 0x00];
		cParam->bitsCmp = inData[curPos + 0x01];
		cParam->subType = inData[curPos + 0x02];	// ignored for DPCM
		cParam->baseVal = ReadLE16(&inData[curPos + 0x03]);
		//cParam->comprTbl = NULL;	// keep the value
		curPos += 0x05;
		break;
	default:
		return 0x80;	// Error: unknown data block compression
	}
	
	retCdbInf->hdrSize = curPos;
	return 0x00;
}